

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::ShaderOptimizationTests::init
          (ShaderOptimizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  ShaderOptimizationTests *pSVar3;
  bool bVar4;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar5;
  TestNode *node_01;
  undefined8 extraout_RAX;
  undefined8 *puVar6;
  long *plVar7;
  ShaderOptimizationCase *pSVar8;
  undefined8 uVar9;
  char cVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  undefined1 uVar19;
  undefined4 uVar20;
  string caseTypeDesc;
  string caseTypeName;
  string description;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream s;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  undefined8 local_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  char *local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  ShaderOptimizationCase *local_238;
  ShaderOptimizationTests *local_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  uint local_1e4;
  TestNode *local_1e0;
  TestNode *local_1d8;
  TestNode *local_1d0;
  TestNode *local_1c8;
  TestNode *local_1c0;
  long local_1b8;
  TestNode *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar1->m_testCtx,"loop_unrolling","Loop Unrolling Cases");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar1->m_testCtx,"loop_invariant_code_motion",
             "Loop-Invariant Code Motion Cases");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar1->m_testCtx,"function_inlining","Function Inlining Cases"
            );
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1e0 = pTVar5;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar1->m_testCtx,"constant_propagation",
             "Constant Propagation Cases");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1d8 = pTVar5;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar1->m_testCtx,"common_subexpression_elimination",
             "Common Subexpression Elimination Cases");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_01 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar1->m_testCtx,"dead_code_elimination",
             "Dead Code Elimination Cases");
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  node_01[1]._vptr_TestNode = (_func_int **)pCVar1;
  local_1b0 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  local_1c0 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,local_1e0);
  tcu::TestNode::addChild((TestNode *)this,local_1d8);
  local_1c8 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_1d0 = node_01;
  tcu::TestNode::addChild((TestNode *)this,node_01);
  local_288 = 0;
  uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_230 = this;
  do {
    local_1e4 = (uint)uVar9;
    local_260 = "_fragment";
    if ((char)uVar9 != '\0') {
      local_260 = "_vertex";
    }
    uVar13 = CONCAT71((int7)((ulong)local_260 >> 8),1);
    uVar20 = 0;
    do {
      cVar10 = (char)uVar13;
      pcVar18 = "dependent_iterations";
      if (cVar10 != '\0') {
        pcVar18 = "independent_iterations";
      }
      local_2a8 = &local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,pcVar18,pcVar18 + (uVar13 & 0xff) * 2 + 0x14);
      pcVar18 = "loop iterations depend on each other";
      if (cVar10 != '\0') {
        pcVar18 = "loop iterations don\'t depend on each other";
      }
      local_238 = (ShaderOptimizationCase *)CONCAT44(local_238._4_4_,(int)uVar13);
      local_2c8 = &local_2b8;
      pcVar14 = pcVar18 + 0x24;
      if (cVar10 != '\0') {
        pcVar14 = pcVar18 + 0x2a;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,pcVar18,pcVar14);
      lVar17 = 0;
      do {
        iVar15 = *(int *)((long)init()::callNestingDepths + lVar17);
        local_228 = &local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_2a8,(long)local_2a8 + local_2a0);
        std::__cxx11::string::append((char *)&local_228);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_228 != &local_218) {
          uVar13 = local_218;
        }
        if (uVar13 < (ulong)(local_200 + local_220)) {
          uVar13 = 0xf;
          if (local_208 != local_1f8) {
            uVar13 = local_1f8[0];
          }
          if (uVar13 < (ulong)(local_200 + local_220)) goto LAB_012c3022;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_228);
        }
        else {
LAB_012c3022:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_208);
        }
        local_280 = &local_270;
        plVar7 = puVar6 + 2;
        if ((long *)*puVar6 == plVar7) {
          local_270 = *plVar7;
          lStack_268 = puVar6[3];
        }
        else {
          local_270 = *plVar7;
          local_280 = (long *)*puVar6;
        }
        local_278 = puVar6[1];
        *puVar6 = plVar7;
        puVar6[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_258 = &local_248;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_248 = *plVar11;
          lStack_240 = plVar7[3];
        }
        else {
          local_248 = *plVar11;
          local_258 = (long *)*plVar7;
        }
        local_250 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_208);
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_218 = *puVar12;
          lStack_210 = plVar7[3];
          local_228 = &local_218;
        }
        else {
          local_218 = *puVar12;
          local_228 = (ulong *)*plVar7;
        }
        local_220 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_2c8);
        local_280 = &local_270;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_270 = *plVar11;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar11;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        pSVar8 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar8,(local_230->super_TestCaseGroup).m_context,(char *)local_258,
                   (char *)local_280,(CaseShaderType)local_288);
        (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_0214b298;
        *(int *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
        *(undefined4 *)
         ((long)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar20
        ;
        tcu::TestNode::addChild(local_1b0,(TestNode *)pSVar8);
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258,local_248 + 1);
        }
        pSVar3 = local_230;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0xc);
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      uVar20 = 1;
      uVar13 = 0;
    } while (((ulong)local_238 & 1) != 0);
    lVar17 = 0;
    do {
      iVar15 = *(int *)((long)init()::callNestingDepths + lVar17);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_2c8 = &local_2b8;
      puVar12 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar12) {
        local_2b8 = *puVar12;
        lStack_2b0 = plVar7[3];
      }
      else {
        local_2b8 = *puVar12;
        local_2c8 = (ulong *)*plVar7;
      }
      local_2c0 = plVar7[1];
      *plVar7 = (long)puVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_298 = *plVar11;
        lStack_290 = plVar7[3];
      }
      else {
        local_298 = *plVar11;
        local_2a8 = (long *)*plVar7;
      }
      local_2a0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      pSVar8 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar8,(pSVar3->super_TestCaseGroup).m_context,(char *)local_2a8,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_288);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0214b348;
      *(int *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
      tcu::TestNode::addChild(local_1c0,(TestNode *)pSVar8);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0xc);
    lVar17 = 0;
    do {
      iVar15 = *(int *)((long)init()::callNestingDepths + lVar17);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_2c8 = &local_2b8;
      puVar12 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar12) {
        local_2b8 = *puVar12;
        lStack_2b0 = plVar7[3];
      }
      else {
        local_2b8 = *puVar12;
        local_2c8 = (ulong *)*plVar7;
      }
      local_2c0 = plVar7[1];
      *plVar7 = (long)puVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_298 = *plVar11;
        lStack_290 = plVar7[3];
      }
      else {
        local_298 = *plVar11;
        local_2a8 = (long *)*plVar7;
      }
      local_2a0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      pSVar8 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar8,(pSVar3->super_TestCaseGroup).m_context,(char *)local_2a8,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_288);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0214b3a0;
      *(int *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
      tcu::TestNode::addChild(local_1e0,(TestNode *)pSVar8);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0xc);
    iVar15 = 0;
    do {
      pcVar18 = "struct";
      if (iVar15 == 1) {
        pcVar18 = "array";
      }
      if (iVar15 == 0) {
        pcVar18 = "built_in_functions";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar18,(allocator<char> *)&local_2a8);
      uVar19 = 0;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,local_1a8,(long)local_1a8 + local_1a0);
        std::__cxx11::string::append((char *)&local_2c8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        local_2a8 = &local_298;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_298 = *plVar11;
          lStack_290 = plVar7[3];
        }
        else {
          local_298 = *plVar11;
          local_2a8 = (long *)*plVar7;
        }
        local_2a0 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        pSVar8 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar8,(local_230->super_TestCaseGroup).m_context,(char *)local_2a8,
                   glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_288);
        (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_0214b3f8;
        *(int *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
        *(undefined1 *)
         ((long)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar19
        ;
        tcu::TestNode::addChild(local_1d8,(TestNode *)pSVar8);
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        uVar19 = 1;
        bVar4 = false;
      } while (bVar2);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 3);
    iVar15 = 0;
    do {
      pcVar18 = "loop";
      if (iVar15 == 2) {
        pcVar18 = "static_branch";
      }
      if (iVar15 == 1) {
        pcVar18 = "multiple_statements";
      }
      if (iVar15 == 0) {
        pcVar18 = "single_statement";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar18,(allocator<char> *)&local_2a8);
      pcVar18 = "Multiple loops performing the same computations";
      if (iVar15 == 2) {
        pcVar18 = "Multiple statements including a static conditional";
      }
      if (iVar15 == 1) {
        pcVar18 = "Multiple statements performing same computations";
      }
      if (iVar15 == 0) {
        pcVar18 = "A single statement containing multiple uses of same subexpression";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,pcVar18,(allocator<char> *)&local_2c8);
      pSVar8 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (local_230->super_TestCaseGroup).m_context;
      local_2c8 = &local_2b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_1a8,(long)local_1a8 + local_1a0);
      std::__cxx11::string::append((char *)&local_2c8);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar8,pCVar1,(char *)local_2c8,(char *)local_2a8,(CaseShaderType)local_288);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0214b450;
      *(int *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
      tcu::TestNode::addChild(local_1c8,(TestNode *)pSVar8);
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 4);
    lVar17 = 0;
    uVar16 = 0;
    do {
      pcVar18 = "Compute a value that is used but multiplied by a zero constant expression";
      if (uVar16 < 8) {
        pcVar18 = (char *)((long)&DAT_01c1b638 + (long)*(int *)((long)&DAT_01c1b638 + lVar17));
      }
      local_1b8 = lVar17;
      local_238 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (local_230->super_TestCaseGroup).m_context;
      local_2c8 = &local_2b8;
      local_2c0 = 0;
      local_2b8 = local_2b8 & 0xffffffffffffff00;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_298 = *plVar11;
        lStack_290 = plVar7[3];
      }
      else {
        local_298 = *plVar11;
        local_2a8 = (long *)*plVar7;
      }
      local_2a0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      pSVar8 = local_238;
      local_1a8 = &local_198;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_198 = *plVar11;
        lStack_190 = plVar7[3];
      }
      else {
        local_198 = *plVar11;
        local_1a8 = (long *)*plVar7;
      }
      local_1a0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (local_238,pCVar1,(char *)local_1a8,pcVar18,(CaseShaderType)local_288);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0214b4a8;
      *(uint *)&pSVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar16;
      tcu::TestNode::addChild(local_1d0,(TestNode *)pSVar8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      uVar16 = uVar16 + 1;
      lVar17 = local_1b8 + 4;
    } while (uVar16 != 9);
    local_288 = 1;
    uVar9 = 0;
    if ((local_1e4 & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

void ShaderOptimizationTests::init (void)
{
	TestCaseGroup* const unrollGroup					= new TestCaseGroup(m_context, "loop_unrolling",					"Loop Unrolling Cases");
	TestCaseGroup* const loopInvariantCodeMotionGroup	= new TestCaseGroup(m_context, "loop_invariant_code_motion",		"Loop-Invariant Code Motion Cases");
	TestCaseGroup* const inlineGroup					= new TestCaseGroup(m_context, "function_inlining",					"Function Inlining Cases");
	TestCaseGroup* const constantPropagationGroup		= new TestCaseGroup(m_context, "constant_propagation",				"Constant Propagation Cases");
	TestCaseGroup* const commonSubexpressionGroup		= new TestCaseGroup(m_context, "common_subexpression_elimination",	"Common Subexpression Elimination Cases");
	TestCaseGroup* const deadCodeEliminationGroup		= new TestCaseGroup(m_context, "dead_code_elimination",				"Dead Code Elimination Cases");
	addChild(unrollGroup);
	addChild(loopInvariantCodeMotionGroup);
	addChild(inlineGroup);
	addChild(constantPropagationGroup);
	addChild(commonSubexpressionGroup);
	addChild(deadCodeEliminationGroup);

	for (int caseShaderTypeI = 0; caseShaderTypeI < CASESHADERTYPE_LAST; caseShaderTypeI++)
	{
		const CaseShaderType	caseShaderType			= (CaseShaderType)caseShaderTypeI;
		const char* const		caseShaderTypeSuffix	= caseShaderType == CASESHADERTYPE_VERTEX		? "_vertex"
														: caseShaderType == CASESHADERTYPE_FRAGMENT		? "_fragment"
														: DE_NULL;

		// Loop unrolling cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int caseTypeI = 0; caseTypeI < LoopUnrollCase::CASETYPE_LAST; caseTypeI++)
			{
				const LoopUnrollCase::CaseType	caseType		= (LoopUnrollCase::CaseType)caseTypeI;
				const string					caseTypeName	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "independent_iterations"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "dependent_iterations"
																: DE_NULL;
				const string					caseTypeDesc	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "loop iterations don't depend on each other"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "loop iterations depend on each other"
																: DE_NULL;

				for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
				{
					const int			loopIterations	= loopIterationCounts[loopIterNdx];
					const string		name			= caseTypeName + "_" + toString(loopIterations) + caseShaderTypeSuffix;
					const string		description		= toString(loopIterations) + " iterations; " + caseTypeDesc;

					unrollGroup->addChild(new LoopUnrollCase(m_context, name.c_str(), description.c_str(), caseShaderType, caseType, loopIterations));
				}
			}
		}

		// Loop-invariant code motion cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
			{
				const int		loopIterations	= loopIterationCounts[loopIterNdx];
				const string	name			= toString(loopIterations) + "_iterations" + caseShaderTypeSuffix;

				loopInvariantCodeMotionGroup->addChild(new LoopInvariantCodeMotionCase(m_context, name.c_str(), "", caseShaderType, loopIterations));
			}
		}

		// Function inlining cases.

		{
			static const int callNestingDepths[] = { 4, 8, 32 };

			for (int nestDepthNdx = 0; nestDepthNdx < DE_LENGTH_OF_ARRAY(callNestingDepths); nestDepthNdx++)
			{
				const int		nestingDepth	= callNestingDepths[nestDepthNdx];
				const string	name			= toString(nestingDepth) + "_nested" + caseShaderTypeSuffix;

				inlineGroup->addChild(new FunctionInliningCase(m_context, name.c_str(), "", caseShaderType, nestingDepth));
			}
		}

		// Constant propagation cases.

		for (int caseTypeI = 0; caseTypeI < ConstantPropagationCase::CASETYPE_LAST; caseTypeI++)
		{
			const ConstantPropagationCase::CaseType		caseType		= (ConstantPropagationCase::CaseType)caseTypeI;
			const string								caseTypeName	= caseType == ConstantPropagationCase::CASETYPE_BUILT_IN_FUNCTIONS		? "built_in_functions"
																		: caseType == ConstantPropagationCase::CASETYPE_ARRAY					? "array"
																		: caseType == ConstantPropagationCase::CASETYPE_STRUCT					? "struct"
																		: DE_NULL;

			for (int constantExpressionsOnlyI = 0; constantExpressionsOnlyI <= 1; constantExpressionsOnlyI++)
			{
				const bool		constantExpressionsOnly		= constantExpressionsOnlyI != 0;
				const string	name						= caseTypeName + (constantExpressionsOnly ? "" : "_no_const") + caseShaderTypeSuffix;

				constantPropagationGroup->addChild(new ConstantPropagationCase(m_context, name.c_str(), "", caseShaderType, caseType, constantExpressionsOnly));
			}
		}

		// Common subexpression cases.

		for (int caseTypeI = 0; caseTypeI < CommonSubexpressionCase::CASETYPE_LAST; caseTypeI++)
		{
			const CommonSubexpressionCase::CaseType		caseType		= (CommonSubexpressionCase::CaseType)caseTypeI;

			const string								caseTypeName	= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "single_statement"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "multiple_statements"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "static_branch"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "loop"
																		: DE_NULL;

			const string								description		= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "A single statement containing multiple uses of same subexpression"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "Multiple statements performing same computations"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "Multiple statements including a static conditional"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "Multiple loops performing the same computations"
																		: DE_NULL;

			commonSubexpressionGroup->addChild(new CommonSubexpressionCase(m_context, (caseTypeName + caseShaderTypeSuffix).c_str(), description.c_str(), caseShaderType, caseType));
		}

		// Dead code elimination cases.

		for (int caseTypeI = 0; caseTypeI < DeadCodeEliminationCase::CASETYPE_LAST; caseTypeI++)
		{
			const DeadCodeEliminationCase::CaseType		caseType				= (DeadCodeEliminationCase::CaseType)caseTypeI;
			const char* const							caseTypeName			= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "dead_branch_simple"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "dead_branch_complex"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "dead_branch_complex_no_const"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "dead_branch_func_call"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "unused_value_basic"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "unused_value_loop"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "unused_value_dead_branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "unused_value_after_return"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "unused_value_mul_zero"
																				: DE_NULL;

			const char* const							caseTypeDescription		= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "Do computation inside a branch that is never taken (condition is simple false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "Do computation inside a branch that is never taken (condition is complex false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "Compute a value that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "Compute a value, using a loop, that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "Compute a value that is used only inside a statically dead branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "Compute a value that is used only after a return statement"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "Compute a value that is used but multiplied by a zero constant expression"
																				: DE_NULL;

			deadCodeEliminationGroup->addChild(new DeadCodeEliminationCase(m_context, (string() + caseTypeName + caseShaderTypeSuffix).c_str(), caseTypeDescription, caseShaderType, caseType));
		}
	}
}